

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrReleaseSwapchainImage(XrSwapchain swapchain,XrSwapchainImageReleaseInfo *releaseInfo)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_2c;
  LoaderInstance *pLStack_28;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSwapchainImageReleaseInfo *releaseInfo_local;
  XrSwapchain swapchain_local;
  
  loader_instance = (LoaderInstance *)releaseInfo;
  releaseInfo_local = (XrSwapchainImageReleaseInfo *)swapchain;
  local_2c = ActiveLoaderInstance::Get(&stack0xffffffffffffffd8,"xrReleaseSwapchainImage");
  if (XR_ERROR_VALIDATION_FAILURE < local_2c) {
    this = LoaderInstance::DispatchTable(pLStack_28);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_2c = (*pXVar1->ReleaseSwapchainImage)
                         ((XrSwapchain)releaseInfo_local,
                          (XrSwapchainImageReleaseInfo *)loader_instance);
  }
  return local_2c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrReleaseSwapchainImage(
    XrSwapchain                                 swapchain,
    const XrSwapchainImageReleaseInfo*          releaseInfo) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrReleaseSwapchainImage");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->ReleaseSwapchainImage(swapchain, releaseInfo);
    }
    return result;
}